

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleanimation.cpp
# Opt level: O0

bool __thiscall QNumberStyleAnimation::isUpdateNeeded(QNumberStyleAnimation *this)

{
  bool bVar1;
  QStyleAnimation *in_RDI;
  qreal qVar2;
  double unaff_retaddr;
  double in_stack_00000008;
  qreal current;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = QStyleAnimation::isUpdateNeeded(in_RDI);
  if (bVar1) {
    qVar2 = currentValue((QNumberStyleAnimation *)
                         CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    bVar1 = qFuzzyCompare(in_stack_00000008,unaff_retaddr);
    if (!bVar1) {
      *(qreal *)&in_RDI[1]._delay = qVar2;
      return true;
    }
  }
  return false;
}

Assistant:

bool QNumberStyleAnimation::isUpdateNeeded() const
{
    if (QStyleAnimation::isUpdateNeeded()) {
        qreal current = currentValue();
        if (!qFuzzyCompare(_prev, current))
        {
            _prev = current;
            return true;
        }
    }
    return false;
}